

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FStateDefine *
FStateDefinitions::FindStateLabelInList
          (TArray<FStateDefine,_FStateDefine> *list,FName *name,bool create)

{
  FStateDefine *pFVar1;
  uint uVar2;
  uint uVar3;
  FStateDefine *pFVar4;
  uint uVar5;
  FStateDefine *pFVar6;
  bool bVar7;
  FStateDefine def;
  FStateDefine local_40;
  
  uVar3 = list->Count;
  bVar7 = uVar3 == 0;
  if (bVar7) {
    pFVar4 = (FStateDefine *)0x0;
  }
  else {
    pFVar4 = list->Array;
    if ((pFVar4->Label).Index != name->Index) {
      pFVar6 = pFVar4;
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (uVar3 == uVar5) {
          pFVar4 = (FStateDefine *)0x0;
          break;
        }
        pFVar4 = pFVar6 + 1;
        pFVar1 = pFVar6 + 1;
        pFVar6 = pFVar4;
        uVar2 = uVar5 + 1;
      } while ((pFVar1->Label).Index != name->Index);
      bVar7 = uVar3 <= uVar5;
    }
  }
  if ((bVar7 & create) == 1) {
    local_40.Children.Array = (FStateDefine *)0x0;
    local_40.Children.Most = 0;
    local_40.Children.Count = 0;
    local_40.Label = (FName)name->Index;
    local_40.State = (FState *)0x0;
    local_40.DefineFlags = '\0';
    uVar3 = TArray<FStateDefine,_FStateDefine>::Push(list,&local_40);
    pFVar4 = list->Array + uVar3;
    TArray<FStateDefine,_FStateDefine>::~TArray(&local_40.Children);
  }
  return pFVar4;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateLabelInList(TArray<FStateDefine> & list, FName name, bool create)
{
	for(unsigned i = 0; i<list.Size(); i++)
	{
		if (list[i].Label == name)
		{
			return &list[i];
		}
	}
	if (create)
	{
		FStateDefine def;
		def.Label = name;
		def.State = NULL;
		def.DefineFlags = SDF_NEXT;
		return &list[list.Push(def)];
	}
	return NULL;
}